

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_transporter.cpp
# Opt level: O2

bool __thiscall
SocketClientTransporter::Connect(SocketClientTransporter *this,string *host,int port,string *err)

{
  bool bVar1;
  int err_00;
  unique_lock<std::mutex> lock;
  sockaddr_storage addr;
  unique_lock<std::mutex> uStack_b8;
  sockaddr_storage local_a8;
  
  (this->uvClient).data = this;
  uv_tcp_init((this->super_Transporter).loop,&this->uvClient);
  bVar1 = Transporter::ParseSocketAddress(host,port,&local_a8,err);
  if (bVar1) {
    (this->connect_req).data = this;
    err_00 = uv_tcp_connect(&this->connect_req,&this->uvClient,(sockaddr *)&local_a8,OnConnectCB);
    if (err_00 == 0) {
      Transporter::StartEventLoop(&this->super_Transporter);
      std::unique_lock<std::mutex>::unique_lock(&uStack_b8,&this->mutex);
      std::condition_variable::wait((unique_lock *)&this->cv);
      if (this->connectionStatus < 0) {
        uv_strerror(this->connectionStatus);
        std::__cxx11::string::assign((char *)err);
      }
      bVar1 = Transporter::IsConnected(&this->super_Transporter);
      std::unique_lock<std::mutex>::~unique_lock(&uStack_b8);
      return bVar1;
    }
    uv_strerror(err_00);
    std::__cxx11::string::assign((char *)err);
  }
  return false;
}

Assistant:

bool SocketClientTransporter::Connect(const std::string& host, int port, std::string& err) {
	uvClient.data = this;
	uv_tcp_init(loop, &uvClient);
	struct sockaddr_storage addr;
	bool addr_suc = ParseSocketAddress(host, port, &addr, err);
	if (!addr_suc) {
		return false;
	}

	connect_req.data = this;
	const int r = uv_tcp_connect(&connect_req, &uvClient, reinterpret_cast<const struct sockaddr*>(&addr), OnConnectCB);
	if (r) {
		err = uv_strerror(r);
		return false;
	}
	StartEventLoop();
	std::unique_lock<std::mutex> lock(mutex);
	cv.wait(lock);
	if (this->connectionStatus < 0) {
		err = uv_strerror(this->connectionStatus);
	}
	return IsConnected();
}